

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

xmlChar * xmlSaveUri(xmlURIPtr uri)

{
  uint uVar1;
  xmlChar *pxVar2;
  char cVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  int lo_5;
  int hi_5;
  int val_5;
  int lo_4;
  int hi_4;
  int val_4;
  int lo_3;
  int hi_3;
  int val_3;
  int lo_2;
  int hi_2;
  int val_2;
  int lo_1;
  int hi_1;
  int val_1;
  int lo;
  int hi;
  int val;
  int max;
  int len;
  char *p;
  xmlChar *temp;
  xmlChar *ret;
  xmlURIPtr uri_local;
  
  temp = (xmlChar *)0x0;
  if (uri == (xmlURIPtr)0x0) {
    return (xmlChar *)0x0;
  }
  hi = 0x50;
  ret = (xmlChar *)uri;
  temp = (xmlChar *)(*xmlMalloc)(0x51);
  if (temp == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  val = 0;
  if (*(long *)ret != 0) {
    _max = *(byte **)ret;
    while (*_max != 0) {
      pxVar2 = temp;
      if ((hi <= val) &&
         (p = (char *)xmlSaveUriRealloc(temp,&hi), pxVar2 = (xmlChar *)p,
         (xmlChar *)p == (xmlChar *)0x0)) goto LAB_001725e8;
      temp = pxVar2;
      temp[val] = *_max;
      val = val + 1;
      _max = _max + 1;
    }
    pxVar2 = temp;
    if ((hi <= val) &&
       (p = (char *)xmlSaveUriRealloc(temp,&hi), pxVar2 = (xmlChar *)p,
       (xmlChar *)p == (xmlChar *)0x0)) goto LAB_001725e8;
    temp = pxVar2;
    temp[val] = ':';
    val = val + 1;
  }
  if (*(long *)(ret + 8) == 0) {
    if ((*(long *)(ret + 0x18) == 0) && (*(int *)(ret + 0x28) == 0)) {
      if (*(long *)(ret + 0x10) == 0) {
        pxVar2 = temp;
        if (((*(long *)ret != 0) && (hi <= val + 3)) &&
           (p = (char *)xmlSaveUriRealloc(temp,&hi), pxVar2 = (xmlChar *)p,
           (xmlChar *)p == (xmlChar *)0x0)) goto LAB_001725e8;
      }
      else {
        pxVar2 = temp;
        if ((hi <= val + 3) &&
           (p = (char *)xmlSaveUriRealloc(temp,&hi), pxVar2 = (xmlChar *)p,
           (xmlChar *)p == (xmlChar *)0x0)) goto LAB_001725e8;
        temp = pxVar2;
        iVar6 = val + 1;
        temp[val] = '/';
        val = val + 2;
        temp[iVar6] = '/';
        for (_max = *(byte **)(ret + 0x10); pxVar2 = temp, *_max != 0; _max = _max + 1) {
          if ((hi <= val + 3) &&
             (p = (char *)xmlSaveUriRealloc(temp,&hi), pxVar2 = (xmlChar *)p,
             (xmlChar *)p == (xmlChar *)0x0)) goto LAB_001725e8;
          temp = pxVar2;
          if (((((char)*_max < 'a') || ('z' < (char)*_max)) &&
              ((((char)*_max < 'A' || ('Z' < (char)*_max)) &&
               (((char)*_max < '0' || ('9' < (char)*_max)))))) &&
             (((((((*_max != 0x2d && (*_max != 0x5f)) && (*_max != 0x2e)) &&
                 ((*_max != 0x21 && (*_max != 0x7e)))) &&
                ((*_max != 0x2a && ((*_max != 0x27 && (*_max != 0x28)))))) && (*_max != 0x29)) &&
              ((((*_max != 0x24 && (*_max != 0x2c)) && (*_max != 0x3b)) &&
               (((*_max != 0x3a && (*_max != 0x40)) &&
                ((*_max != 0x26 && ((*_max != 0x3d && (*_max != 0x2b)))))))))))) {
            uVar1 = *_max / 0x10;
            uVar5 = (uint)*_max % 0x10;
            temp[val] = '%';
            cVar3 = '0';
            if (9 < uVar1) {
              cVar3 = '7';
            }
            iVar6 = val + 2;
            temp[val + 1] = (char)uVar1 + cVar3;
            cVar3 = '0';
            if (9 < uVar5) {
              cVar3 = '7';
            }
            val = val + 3;
            temp[iVar6] = (char)uVar5 + cVar3;
          }
          else {
            temp[val] = *_max;
            val = val + 1;
          }
        }
      }
    }
    else {
      pxVar2 = temp;
      if ((hi <= val + 3) &&
         (p = (char *)xmlSaveUriRealloc(temp,&hi), pxVar2 = (xmlChar *)p,
         (xmlChar *)p == (xmlChar *)0x0)) goto LAB_001725e8;
      temp = pxVar2;
      iVar6 = val + 1;
      temp[val] = '/';
      val = val + 2;
      temp[iVar6] = '/';
      if (*(long *)(ret + 0x20) != 0) {
        for (_max = *(byte **)(ret + 0x20); *_max != 0; _max = _max + 1) {
          pxVar2 = temp;
          if ((hi <= val + 3) &&
             (p = (char *)xmlSaveUriRealloc(temp,&hi), pxVar2 = (xmlChar *)p,
             (xmlChar *)p == (xmlChar *)0x0)) goto LAB_001725e8;
          temp = pxVar2;
          if (((((((char)*_max < 'a') || ('z' < (char)*_max)) &&
                (((char)*_max < 'A' || ('Z' < (char)*_max)))) &&
               (((char)*_max < '0' || ('9' < (char)*_max)))) &&
              (((((((*_max != 0x2d && (*_max != 0x5f)) && (*_max != 0x2e)) &&
                  (((*_max != 0x21 && (*_max != 0x7e)) &&
                   ((*_max != 0x2a && ((*_max != 0x27 && (*_max != 0x28)))))))) && (*_max != 0x29))
                && (((*_max != 0x3b && (*_max != 0x3a)) && (*_max != 0x26)))) &&
               ((*_max != 0x3d && (*_max != 0x2b)))))) && ((*_max != 0x24 && (*_max != 0x2c)))) {
            uVar1 = *_max / 0x10;
            uVar5 = (uint)*_max % 0x10;
            temp[val] = '%';
            cVar3 = '0';
            if (9 < uVar1) {
              cVar3 = '7';
            }
            iVar6 = val + 2;
            temp[val + 1] = (char)uVar1 + cVar3;
            cVar3 = '0';
            if (9 < uVar5) {
              cVar3 = '7';
            }
            val = val + 3;
            temp[iVar6] = (char)uVar5 + cVar3;
          }
          else {
            temp[val] = *_max;
            val = val + 1;
          }
        }
        pxVar2 = temp;
        if ((hi <= val + 3) &&
           (p = (char *)xmlSaveUriRealloc(temp,&hi), pxVar2 = (xmlChar *)p,
           (xmlChar *)p == (xmlChar *)0x0)) goto LAB_001725e8;
        temp = pxVar2;
        temp[val] = '@';
        val = val + 1;
      }
      if (*(long *)(ret + 0x18) != 0) {
        _max = *(byte **)(ret + 0x18);
        while (*_max != 0) {
          pxVar2 = temp;
          if ((hi <= val) &&
             (p = (char *)xmlSaveUriRealloc(temp,&hi), pxVar2 = (xmlChar *)p,
             (xmlChar *)p == (xmlChar *)0x0)) goto LAB_001725e8;
          temp = pxVar2;
          temp[val] = *_max;
          val = val + 1;
          _max = _max + 1;
        }
      }
      pxVar2 = temp;
      if (0 < *(int *)(ret + 0x28)) {
        if ((hi <= val + 10) &&
           (p = (char *)xmlSaveUriRealloc(temp,&hi), pxVar2 = (xmlChar *)p,
           (xmlChar *)p == (xmlChar *)0x0)) goto LAB_001725e8;
        temp = pxVar2;
        iVar6 = snprintf((char *)(temp + val),(long)(hi - val),":%d",(ulong)*(uint *)(ret + 0x28));
        val = iVar6 + val;
        pxVar2 = temp;
      }
    }
    temp = pxVar2;
    if (*(long *)(ret + 0x30) != 0) {
      _max = *(byte **)(ret + 0x30);
      if ((((*(long *)ret != 0) && (*_max == 0x2f)) &&
          (((('`' < (char)_max[1] && ((char)_max[1] < '{')) ||
            (('@' < (char)_max[1] && ((char)_max[1] < '[')))) && (_max[2] == 0x3a)))) &&
         (iVar6 = xmlStrEqual(*(xmlChar **)ret,(xmlChar *)"file"), iVar6 != 0)) {
        pxVar2 = temp;
        if ((hi <= val + 3) &&
           (p = (char *)xmlSaveUriRealloc(temp,&hi), pxVar2 = (xmlChar *)p,
           (xmlChar *)p == (xmlChar *)0x0)) goto LAB_001725e8;
        temp = pxVar2;
        temp[val] = *_max;
        pbVar4 = _max + 2;
        iVar6 = val + 2;
        temp[val + 1] = _max[1];
        _max = _max + 3;
        val = val + 3;
        temp[iVar6] = *pbVar4;
      }
      for (; *_max != 0; _max = _max + 1) {
        pxVar2 = temp;
        if ((hi <= val + 3) &&
           (p = (char *)xmlSaveUriRealloc(temp,&hi), pxVar2 = (xmlChar *)p,
           (xmlChar *)p == (xmlChar *)0x0)) goto LAB_001725e8;
        temp = pxVar2;
        if (((((char)*_max < 'a') || ('z' < (char)*_max)) &&
            ((((char)*_max < 'A' || ('Z' < (char)*_max)) &&
             (((char)*_max < '0' || ('9' < (char)*_max)))))) &&
           (((((*_max != 0x2d && (*_max != 0x5f)) && (*_max != 0x2e)) &&
             ((((*_max != 0x21 && (*_max != 0x7e)) &&
               ((*_max != 0x2a && ((*_max != 0x27 && (*_max != 0x28)))))) && (*_max != 0x29)))) &&
            (((((*_max != 0x2f && (*_max != 0x3b)) && (*_max != 0x40)) &&
              ((*_max != 0x26 && (*_max != 0x3d)))) &&
             ((*_max != 0x2b && ((*_max != 0x24 && (*_max != 0x2c)))))))))) {
          uVar1 = *_max / 0x10;
          uVar5 = (uint)*_max % 0x10;
          temp[val] = '%';
          cVar3 = '0';
          if (9 < uVar1) {
            cVar3 = '7';
          }
          iVar6 = val + 2;
          temp[val + 1] = (char)uVar1 + cVar3;
          cVar3 = '0';
          if (9 < uVar5) {
            cVar3 = '7';
          }
          val = val + 3;
          temp[iVar6] = (char)uVar5 + cVar3;
        }
        else {
          temp[val] = *_max;
          val = val + 1;
        }
      }
    }
    if (*(long *)(ret + 0x50) == 0) {
      if (*(long *)(ret + 0x38) != 0) {
        pxVar2 = temp;
        if ((hi <= val + 3) &&
           (p = (char *)xmlSaveUriRealloc(temp,&hi), pxVar2 = (xmlChar *)p,
           (xmlChar *)p == (xmlChar *)0x0)) goto LAB_001725e8;
        temp = pxVar2;
        temp[val] = '?';
        val = val + 1;
        for (_max = *(byte **)(ret + 0x38); *_max != 0; _max = _max + 1) {
          pxVar2 = temp;
          if ((hi <= val + 3) &&
             (p = (char *)xmlSaveUriRealloc(temp,&hi), pxVar2 = (xmlChar *)p,
             (xmlChar *)p == (xmlChar *)0x0)) goto LAB_001725e8;
          temp = pxVar2;
          if ((((((char)*_max < 'a') || ('z' < (char)*_max)) &&
               (((char)*_max < 'A' || ('Z' < (char)*_max)))) &&
              (((char)*_max < '0' || ('9' < (char)*_max)))) &&
             (((((((*_max != 0x2d && (*_max != 0x5f)) && (*_max != 0x2e)) &&
                 (((*_max != 0x21 && (*_max != 0x7e)) &&
                  ((*_max != 0x2a && ((*_max != 0x27 && (*_max != 0x28)))))))) && (*_max != 0x29))
               && (((*_max != 0x3b && (*_max != 0x2f)) && (*_max != 0x3f)))) &&
              ((((*_max != 0x3a && (*_max != 0x40)) &&
                ((*_max != 0x26 && ((*_max != 0x3d && (*_max != 0x2b)))))) &&
               ((*_max != 0x24 && (((*_max != 0x2c && (*_max != 0x5b)) && (*_max != 0x5d)))))))))) {
            uVar1 = *_max / 0x10;
            uVar5 = (uint)*_max % 0x10;
            temp[val] = '%';
            cVar3 = '0';
            if (9 < uVar1) {
              cVar3 = '7';
            }
            iVar6 = val + 2;
            temp[val + 1] = (char)uVar1 + cVar3;
            cVar3 = '0';
            if (9 < uVar5) {
              cVar3 = '7';
            }
            val = val + 3;
            temp[iVar6] = (char)uVar5 + cVar3;
          }
          else {
            temp[val] = *_max;
            val = val + 1;
          }
        }
      }
    }
    else {
      pxVar2 = temp;
      if ((hi <= val + 1) &&
         (p = (char *)xmlSaveUriRealloc(temp,&hi), pxVar2 = (xmlChar *)p,
         (xmlChar *)p == (xmlChar *)0x0)) goto LAB_001725e8;
      temp = pxVar2;
      temp[val] = '?';
      _max = *(byte **)(ret + 0x50);
      iVar6 = val;
      while (val = iVar6 + 1, *_max != 0) {
        pxVar2 = temp;
        if ((hi <= iVar6 + 2) &&
           (p = (char *)xmlSaveUriRealloc(temp,&hi), pxVar2 = (xmlChar *)p,
           (xmlChar *)p == (xmlChar *)0x0)) goto LAB_001725e8;
        temp = pxVar2;
        temp[val] = *_max;
        _max = _max + 1;
        iVar6 = val;
      }
    }
  }
  else {
    for (_max = *(byte **)(ret + 8); *_max != 0; _max = _max + 1) {
      pxVar2 = temp;
      if ((hi <= val + 3) &&
         (p = (char *)xmlSaveUriRealloc(temp,&hi), pxVar2 = (xmlChar *)p,
         (xmlChar *)p == (xmlChar *)0x0)) goto LAB_001725e8;
      temp = pxVar2;
      if (((((*_max == 0x3b) || (((*_max == 0x2f || (*_max == 0x3f)) || (*_max == 0x3a)))) ||
           (((*_max == 0x40 || (*_max == 0x26)) || (*_max == 0x3d)))) ||
          ((((*_max == 0x2b || (*_max == 0x24)) ||
            ((*_max == 0x2c || ((*_max == 0x5b || (*_max == 0x5d)))))) ||
           ((('`' < (char)*_max && ((char)*_max < '{')) ||
            (('@' < (char)*_max && ((char)*_max < '[')))))))) ||
         ((('/' < (char)*_max && ((char)*_max < ':')) ||
          ((((((*_max == 0x2d || (*_max == 0x5f)) || (*_max == 0x2e)) ||
             ((*_max == 0x21 || (*_max == 0x7e)))) || (*_max == 0x2a)) ||
           (((*_max == 0x27 || (*_max == 0x28)) || (*_max == 0x29)))))))) {
        temp[val] = *_max;
        val = val + 1;
      }
      else {
        uVar1 = *_max / 0x10;
        uVar5 = (uint)*_max % 0x10;
        temp[val] = '%';
        cVar3 = '0';
        if (9 < uVar1) {
          cVar3 = '7';
        }
        iVar6 = val + 2;
        temp[val + 1] = (char)uVar1 + cVar3;
        cVar3 = '0';
        if (9 < uVar5) {
          cVar3 = '7';
        }
        val = val + 3;
        temp[iVar6] = (char)uVar5 + cVar3;
      }
    }
  }
  if (*(long *)(ret + 0x40) != 0) {
    pxVar2 = temp;
    if ((hi <= val + 3) &&
       (p = (char *)xmlSaveUriRealloc(temp,&hi), pxVar2 = (xmlChar *)p,
       (xmlChar *)p == (xmlChar *)0x0)) goto LAB_001725e8;
    temp = pxVar2;
    temp[val] = '#';
    val = val + 1;
    for (_max = *(byte **)(ret + 0x40); *_max != 0; _max = _max + 1) {
      pxVar2 = temp;
      if ((hi <= val + 3) &&
         (p = (char *)xmlSaveUriRealloc(temp,&hi), pxVar2 = (xmlChar *)p,
         (xmlChar *)p == (xmlChar *)0x0)) goto LAB_001725e8;
      temp = pxVar2;
      if ((((((char)*_max < 'a') || ('z' < (char)*_max)) &&
           ((((char)*_max < 'A' || ('Z' < (char)*_max)) &&
            (((char)*_max < '0' || ('9' < (char)*_max)))))) &&
          ((((((*_max != 0x2d && (*_max != 0x5f)) && (*_max != 0x2e)) &&
             ((*_max != 0x21 && (*_max != 0x7e)))) && (*_max != 0x2a)) &&
           (((*_max != 0x27 && (*_max != 0x28)) &&
            ((*_max != 0x29 && (((*_max != 0x3b && (*_max != 0x2f)) && (*_max != 0x3f)))))))))) &&
         (((*_max != 0x3a && (*_max != 0x40)) &&
          ((*_max != 0x26 &&
           (((*_max != 0x3d && (*_max != 0x2b)) &&
            ((*_max != 0x24 && (((*_max != 0x2c && (*_max != 0x5b)) && (*_max != 0x5d)))))))))))) {
        uVar1 = *_max / 0x10;
        uVar5 = (uint)*_max % 0x10;
        temp[val] = '%';
        cVar3 = '0';
        if (9 < uVar1) {
          cVar3 = '7';
        }
        iVar6 = val + 2;
        temp[val + 1] = (char)uVar1 + cVar3;
        cVar3 = '0';
        if (9 < uVar5) {
          cVar3 = '7';
        }
        val = val + 3;
        temp[iVar6] = (char)uVar5 + cVar3;
      }
      else {
        temp[val] = *_max;
        val = val + 1;
      }
    }
  }
  pxVar2 = temp;
  if ((val < hi) || (pxVar2 = xmlSaveUriRealloc(temp,&hi), pxVar2 != (xmlChar *)0x0)) {
    temp = pxVar2;
    temp[val] = '\0';
    return temp;
  }
LAB_001725e8:
  p = (char *)0x0;
  (*xmlFree)(temp);
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlSaveUri(xmlURIPtr uri) {
    xmlChar *ret = NULL;
    xmlChar *temp;
    const char *p;
    int len;
    int max;

    if (uri == NULL) return(NULL);


    max = 80;
    ret = xmlMalloc(max + 1);
    if (ret == NULL)
	return(NULL);
    len = 0;

    if (uri->scheme != NULL) {
	p = uri->scheme;
	while (*p != 0) {
	    if (len >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
		ret = temp;
	    }
	    ret[len++] = *p++;
	}
	if (len >= max) {
            temp = xmlSaveUriRealloc(ret, &max);
            if (temp == NULL) goto mem_error;
            ret = temp;
	}
	ret[len++] = ':';
    }
    if (uri->opaque != NULL) {
	p = uri->opaque;
	while (*p != 0) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    if (IS_RESERVED(*(p)) || IS_UNRESERVED(*(p)))
		ret[len++] = *p++;
	    else {
		int val = *(unsigned char *)p++;
		int hi = val / 0x10, lo = val % 0x10;
		ret[len++] = '%';
		ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		ret[len++] = lo + (lo > 9? 'A'-10 : '0');
	    }
	}
    } else {
	if ((uri->server != NULL) || (uri->port != PORT_EMPTY)) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '/';
	    ret[len++] = '/';
	    if (uri->user != NULL) {
		p = uri->user;
		while (*p != 0) {
		    if (len + 3 >= max) {
                        temp = xmlSaveUriRealloc(ret, &max);
                        if (temp == NULL) goto mem_error;
                        ret = temp;
		    }
		    if ((IS_UNRESERVED(*(p))) ||
			((*(p) == ';')) || ((*(p) == ':')) ||
			((*(p) == '&')) || ((*(p) == '=')) ||
			((*(p) == '+')) || ((*(p) == '$')) ||
			((*(p) == ',')))
			ret[len++] = *p++;
		    else {
			int val = *(unsigned char *)p++;
			int hi = val / 0x10, lo = val % 0x10;
			ret[len++] = '%';
			ret[len++] = hi + (hi > 9? 'A'-10 : '0');
			ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		    }
		}
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = '@';
	    }
	    if (uri->server != NULL) {
		p = uri->server;
		while (*p != 0) {
		    if (len >= max) {
			temp = xmlSaveUriRealloc(ret, &max);
			if (temp == NULL) goto mem_error;
			ret = temp;
		    }
                    /* TODO: escaping? */
		    ret[len++] = (xmlChar) *p++;
		}
	    }
            if (uri->port > 0) {
                if (len + 10 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
                }
                len += snprintf((char *) &ret[len], max - len, ":%d", uri->port);
            }
	} else if (uri->authority != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '/';
	    ret[len++] = '/';
	    p = uri->authority;
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) ||
                    ((*(p) == '$')) || ((*(p) == ',')) || ((*(p) == ';')) ||
                    ((*(p) == ':')) || ((*(p) == '@')) || ((*(p) == '&')) ||
                    ((*(p) == '=')) || ((*(p) == '+')))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	} else if (uri->scheme != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	}
	if (uri->path != NULL) {
	    p = uri->path;
	    /*
	     * the colon in file:///d: should not be escaped or
	     * Windows accesses fail later.
	     */
	    if ((uri->scheme != NULL) &&
		(p[0] == '/') &&
		(((p[1] >= 'a') && (p[1] <= 'z')) ||
		 ((p[1] >= 'A') && (p[1] <= 'Z'))) &&
		(p[2] == ':') &&
	        (xmlStrEqual(BAD_CAST uri->scheme, BAD_CAST "file"))) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = *p++;
		ret[len++] = *p++;
		ret[len++] = *p++;
	    }
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) || ((*(p) == '/')) ||
                    ((*(p) == ';')) || ((*(p) == '@')) || ((*(p) == '&')) ||
	            ((*(p) == '=')) || ((*(p) == '+')) || ((*(p) == '$')) ||
	            ((*(p) == ',')))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	}
	if (uri->query_raw != NULL) {
	    if (len + 1 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '?';
	    p = uri->query_raw;
	    while (*p != 0) {
		if (len + 1 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = *p++;
	    }
	} else if (uri->query != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '?';
	    p = uri->query;
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) || (IS_RESERVED(*(p))))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	}
    }
    if (uri->fragment != NULL) {
	if (len + 3 >= max) {
            temp = xmlSaveUriRealloc(ret, &max);
            if (temp == NULL) goto mem_error;
            ret = temp;
	}
	ret[len++] = '#';
	p = uri->fragment;
	while (*p != 0) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    if ((IS_UNRESERVED(*(p))) || (IS_RESERVED(*(p))))
		ret[len++] = *p++;
	    else {
		int val = *(unsigned char *)p++;
		int hi = val / 0x10, lo = val % 0x10;
		ret[len++] = '%';
		ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		ret[len++] = lo + (lo > 9? 'A'-10 : '0');
	    }
	}
    }
    if (len >= max) {
        temp = xmlSaveUriRealloc(ret, &max);
        if (temp == NULL) goto mem_error;
        ret = temp;
    }
    ret[len] = 0;
    return(ret);

mem_error:
    xmlFree(ret);
    return(NULL);
}